

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindBinaryFloatingPoint<duckdb::DivideOperator>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  ClientConfig *pCVar2;
  NotImplementedException *this;
  PhysicalType type;
  uint uVar3;
  _Any_data local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  string local_48;
  
  pCVar2 = ClientConfig::GetConfig((ClientContext *)bound_function);
  if (pCVar2->ieee_floating_point_ops != true) {
    GetBinaryFunctionIgnoreZero<duckdb::DivideOperator>
              ((scalar_function_t *)&local_a8,
               *(PhysicalType *)
                ((long)&arguments[6].
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1));
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &arguments[7].
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_a8);
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
    goto LAB_0104f77a;
  }
  bVar1 = *(byte *)((long)&arguments[6].
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
  local_58 = (code *)0x0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (bVar1 == 0xc) {
    local_a8._M_unused._M_object =
         ScalarFunction::BinaryFunction<double,double,double,duckdb::DivideOperator>;
LAB_0104f66b:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_68._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_a8);
  }
  else {
    if (bVar1 == 0xb) {
      local_a8._M_unused._M_object =
           ScalarFunction::BinaryFunction<float,float,float,duckdb::DivideOperator>;
      goto LAB_0104f66b;
    }
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (code *)0x0;
    uStack_70 = 0;
    switch(bVar1) {
    case 2:
      local_a8._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::DivideOperator>;
      break;
    case 3:
      local_a8._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<signed_char,signed_char,signed_char,duckdb::DivideOperator>;
      break;
    case 4:
      local_a8._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::DivideOperator>;
      break;
    case 5:
      local_a8._M_unused._M_object =
           ScalarFunction::BinaryFunction<short,short,short,duckdb::DivideOperator>;
      break;
    case 6:
      local_a8._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::DivideOperator>;
      break;
    case 7:
      local_a8._M_unused._M_object =
           ScalarFunction::BinaryFunction<int,int,int,duckdb::DivideOperator>;
      break;
    case 8:
      local_a8._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::DivideOperator>;
      break;
    case 9:
      local_a8._M_unused._M_object =
           ScalarFunction::BinaryFunction<long,long,long,duckdb::DivideOperator>;
      break;
    default:
      uVar3 = (uint)bVar1;
      if (uVar3 == 0xcb) {
        local_a8._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::DivideOperator>
        ;
      }
      else {
        if (uVar3 != 0xcc) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_a8._M_unused._M_object = &local_98;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Unimplemented type for GetScalarBinaryFunction: %s","");
          TypeIdToString_abi_cxx11_(&local_48,(duckdb *)(ulong)uVar3,type);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_a8._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DivideOperator>
        ;
      }
    }
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_88._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_a8);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_68,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
  }
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            &arguments[7].
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
            (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            &local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
LAB_0104f77a:
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> BindBinaryFloatingPoint(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	auto &config = ClientConfig::GetConfig(context);
	if (config.ieee_floating_point_ops) {
		bound_function.function = GetScalarBinaryFunction<OP>(bound_function.return_type.InternalType());
	} else {
		bound_function.function = GetBinaryFunctionIgnoreZero<OP>(bound_function.return_type.InternalType());
	}
	return nullptr;
}